

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O1

UDataMemory *
udata_openChoice_63(char *path,char *type,char *name,UDataMemoryIsAcceptable *isAcceptable,
                   void *context,UErrorCode *pErrorCode)

{
  bool bVar1;
  UBool UVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  CharString *pCVar7;
  UDataMemory *pUVar8;
  char *dataPath;
  ulong in_RAX;
  UErrorCode UVar9;
  StringPiece *this;
  long lVar10;
  UErrorCode *context_00;
  UErrorCode *in_stack_fffffffffffffdd8;
  byte bVar11;
  undefined4 uVar12;
  UErrorCode UVar13;
  CharString CStack_200;
  StringPiece SStack_1c0;
  StringPiece SStack_1b0;
  StringPiece SStack_1a0;
  StringPiece SStack_190;
  StringPiece SStack_180;
  StringPiece SStack_170;
  StringPiece SStack_160;
  StringPiece SStack_150;
  CharString CStack_140;
  CharString CStack_100;
  CharString CStack_c0;
  StringPiece SStack_80;
  StringPiece SStack_70;
  StringPiece SStack_60;
  StringPiece SStack_50;
  StringPiece SStack_40;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (U_ZERO_ERROR < *pErrorCode)) {
    return (UDataMemory *)0x0;
  }
  if (((name == (char *)0x0) || (isAcceptable == (UDataMemoryIsAcceptable *)0x0)) || (*name == '\0')
     ) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UDataMemory *)0x0;
  }
  UVar13 = U_ZERO_ERROR;
  if (path == (char *)0x0) {
LAB_00352381:
    uVar12 = (undefined4)CONCAT71((int7)(in_RAX >> 8),1);
    bVar1 = false;
  }
  else {
    uVar3 = strcmp(path,"ICUDATA");
    in_RAX = (ulong)uVar3;
    if (uVar3 == 0) goto LAB_00352381;
    uVar3 = strncmp(path,"icudt63l-",9);
    in_RAX = (ulong)uVar3;
    if (uVar3 == 0) goto LAB_00352381;
    uVar3 = strncmp(path,"ICUDATA-",8);
    in_RAX = (ulong)uVar3;
    if (uVar3 == 0) goto LAB_00352381;
    bVar1 = true;
    uVar12 = 0;
  }
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&CStack_100.buffer);
  CStack_100.len = 0;
  *CStack_100.buffer.ptr = '\0';
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&CStack_c0.buffer);
  CStack_c0.len = 0;
  *CStack_c0.buffer.ptr = '\0';
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&CStack_200.buffer);
  CStack_200.len = 0;
  *CStack_200.buffer.ptr = '\0';
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&CStack_140.buffer);
  CStack_140.len = 0;
  *CStack_140.buffer.ptr = '\0';
  if (path == (char *)0x0) {
    icu_63::StringPiece::StringPiece(&SStack_150,"icudt63l");
    icu_63::CharString::append(&CStack_200,SStack_150.ptr_,SStack_150.length_,pErrorCode);
    path = (char *)0x0;
  }
  else {
    pcVar5 = strrchr(path,0x2f);
    pcVar6 = strchr(path,0x2f);
    UVar2 = uprv_pathIsAbsolute_63(path);
    if (pcVar5 == pcVar6 && UVar2 == '\0') {
      pcVar5 = strchr(path,0x2d);
      if (pcVar5 == (char *)0x0) {
        if (bVar1) {
          this = &SStack_80;
          icu_63::StringPiece::StringPiece(this,path);
        }
        else {
          this = &SStack_70;
          icu_63::StringPiece::StringPiece(this,"icudt63l");
        }
      }
      else {
        icu_63::StringPiece::StringPiece(&SStack_160,pcVar5 + 1);
        icu_63::CharString::append(&CStack_140,SStack_160.ptr_,SStack_160.length_,pErrorCode);
        if (bVar1) {
          icu_63::CharString::append(&CStack_200,path,(int)pcVar5 - (int)path,pErrorCode);
          if (pcVar6 == (char *)0x0) {
            path = CStack_200.buffer.ptr;
          }
          goto LAB_0035258e;
        }
        this = &SStack_60;
        icu_63::StringPiece::StringPiece(this,"icudt63l");
      }
    }
    else if (pcVar5 == (char *)0x0) {
      this = &SStack_50;
      icu_63::StringPiece::StringPiece(this,path);
    }
    else {
      this = &SStack_40;
      icu_63::StringPiece::StringPiece(this,pcVar5 + 1);
    }
    icu_63::CharString::append(&CStack_200,this->ptr_,this->length_,pErrorCode);
  }
LAB_0035258e:
  icu_63::CharString::append(&CStack_100,CStack_200.buffer.ptr,CStack_200.len,pErrorCode);
  icu_63::CharString::append(&CStack_c0,CStack_200.buffer.ptr,CStack_200.len,pErrorCode);
  lVar10 = (long)CStack_100.len;
  if (CStack_140.len != 0) {
    pCVar7 = icu_63::CharString::append(&CStack_100,'/',pErrorCode);
    icu_63::CharString::append(pCVar7,CStack_140.buffer.ptr,CStack_140.len,pErrorCode);
    pCVar7 = icu_63::CharString::append(&CStack_c0,'/',pErrorCode);
    icu_63::CharString::append(pCVar7,CStack_140.buffer.ptr,CStack_140.len,pErrorCode);
  }
  pCVar7 = icu_63::CharString::append(&CStack_100,'/',pErrorCode);
  icu_63::StringPiece::StringPiece(&SStack_170,name);
  icu_63::CharString::append(pCVar7,SStack_170.ptr_,SStack_170.length_,pErrorCode);
  pCVar7 = icu_63::CharString::append(&CStack_c0,'/',pErrorCode);
  icu_63::StringPiece::StringPiece(&SStack_180,name);
  icu_63::CharString::append(pCVar7,SStack_180.ptr_,SStack_180.length_,pErrorCode);
  if ((type != (char *)0x0) && (*type != '\0')) {
    icu_63::StringPiece::StringPiece(&SStack_190,".");
    pCVar7 = icu_63::CharString::append(&CStack_100,SStack_190.ptr_,SStack_190.length_,pErrorCode);
    icu_63::StringPiece::StringPiece(&SStack_1a0,type);
    icu_63::CharString::append(pCVar7,SStack_1a0.ptr_,SStack_1a0.length_,pErrorCode);
    icu_63::StringPiece::StringPiece(&SStack_1b0,".");
    pCVar7 = icu_63::CharString::append(&CStack_c0,SStack_1b0.ptr_,SStack_1b0.length_,pErrorCode);
    icu_63::StringPiece::StringPiece(&SStack_1c0,type);
    icu_63::CharString::append(pCVar7,SStack_1c0.ptr_,SStack_1c0.length_,pErrorCode);
  }
  pcVar5 = "icudt63l";
  if (path != (char *)0x0) {
    pcVar5 = path;
  }
  context_00 = (UErrorCode *)0x352798;
  pcVar6 = u_getDataDirectory_63();
  if ((char)uVar12 == '\0') {
LAB_003527bf:
    pUVar8 = (UDataMemory *)0x0;
  }
  else {
    context_00 = (UErrorCode *)0x3527b7;
    iVar4 = strcmp(type,"res");
    if (iVar4 != 0) goto LAB_003527bf;
    iVar4 = strcmp(name,"zoneinfo64");
    if (((iVar4 != 0) && (iVar4 = strcmp(name,"timezoneTypes"), iVar4 != 0)) &&
       (iVar4 = strcmp(name,"windowsZones"), iVar4 != 0)) {
      context_00 = (UErrorCode *)0x35295e;
      iVar4 = strcmp(name,"metaZones");
      if (iVar4 != 0) goto LAB_003527bf;
    }
    context_00 = (UErrorCode *)0x35296e;
    dataPath = u_getTimeZoneFilesDirectory_63(pErrorCode);
    if ((*dataPath == '\0') ||
       ((context_00 = pErrorCode,
        pUVar8 = doLoadFromIndividualFiles
                           ("",dataPath,CStack_c0.buffer.ptr + lVar10 + 1,"",type,name,isAcceptable,
                            context,(UErrorCode *)&stack0xfffffffffffffde4,pErrorCode),
        pUVar8 == (UDataMemory *)0x0 && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)))) {
      bVar1 = true;
      pUVar8 = (UDataMemory *)0x0;
    }
    else {
      bVar1 = false;
    }
    if (!bVar1) goto LAB_00352a14;
  }
  if (gDataFileAccess == UDATA_PACKAGES_FIRST) {
    pUVar8 = doLoadFromCommonData
                       ((UBool)uVar12,CStack_100.buffer.ptr,pcVar5,type,name,(char *)isAcceptable,
                        (char *)context,&stack0xfffffffffffffde4,
                        (UDataMemoryIsAcceptable *)pErrorCode,context_00,in_stack_fffffffffffffdd8,
                        (UErrorCode *)CONCAT44(UVar13,uVar12));
    if ((pUVar8 != (UDataMemory *)0x0) || (U_ZERO_ERROR < *pErrorCode)) goto LAB_00352a14;
    pUVar8 = (UDataMemory *)0x0;
  }
  if ((gDataFileAccess & ~UDATA_PACKAGES_FIRST) == UDATA_DEFAULT_ACCESS) {
    bVar11 = (byte)uVar12;
    if (pcVar6 != (char *)0x0) {
      bVar11 = bVar11 & *pcVar6 == '\0';
    }
    if (bVar11 == 0) {
      context_00 = pErrorCode;
      pUVar8 = doLoadFromIndividualFiles
                         (CStack_200.buffer.ptr,pcVar6,CStack_c0.buffer.ptr + lVar10 + 1,pcVar5,type
                          ,name,isAcceptable,context,(UErrorCode *)&stack0xfffffffffffffde4,
                          pErrorCode);
      if ((pUVar8 != (UDataMemory *)0x0) || (U_ZERO_ERROR < *pErrorCode)) goto LAB_00352a14;
      pUVar8 = (UDataMemory *)0x0;
    }
  }
  if (gDataFileAccess < UDATA_PACKAGES_FIRST) {
    pUVar8 = doLoadFromCommonData
                       ((UBool)uVar12,CStack_100.buffer.ptr,pcVar5,type,name,(char *)isAcceptable,
                        (char *)context,&stack0xfffffffffffffde4,
                        (UDataMemoryIsAcceptable *)pErrorCode,context_00,in_stack_fffffffffffffdd8,
                        (UErrorCode *)CONCAT44(UVar13,uVar12));
    if ((pUVar8 != (UDataMemory *)0x0) || (U_ZERO_ERROR < *pErrorCode)) goto LAB_00352a14;
    pUVar8 = (UDataMemory *)0x0;
  }
  if (gDataFileAccess == UDATA_NO_FILES) {
    pUVar8 = doLoadFromCommonData
                       ((UBool)uVar12,CStack_100.buffer.ptr,pcVar5,type,name,(char *)isAcceptable,
                        (char *)context,&stack0xfffffffffffffde4,
                        (UDataMemoryIsAcceptable *)pErrorCode,context_00,in_stack_fffffffffffffdd8,
                        (UErrorCode *)CONCAT44(UVar13,uVar12));
    if ((pUVar8 != (UDataMemory *)0x0) || (U_ZERO_ERROR < *pErrorCode)) goto LAB_00352a14;
    pUVar8 = (UDataMemory *)0x0;
  }
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar9 = U_FILE_ACCESS_ERROR;
    if (U_ZERO_ERROR < UVar13) {
      UVar9 = UVar13;
    }
    *pErrorCode = UVar9;
  }
LAB_00352a14:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&CStack_140.buffer);
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&CStack_200.buffer);
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&CStack_c0.buffer);
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&CStack_100.buffer);
  return pUVar8;
}

Assistant:

U_CAPI UDataMemory * U_EXPORT2
udata_openChoice(const char *path, const char *type, const char *name,
                 UDataMemoryIsAcceptable *isAcceptable, void *context,
                 UErrorCode *pErrorCode) {
#ifdef UDATA_DEBUG
  fprintf(stderr, "udata_openChoice(): Opening: %s : %s . %s\n", (path?path:"NULL"), name, type);
#endif

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return NULL;
    } else if(name==NULL || *name==0 || isAcceptable==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    } else {
        return doOpenChoice(path, type, name, isAcceptable, context, pErrorCode);
    }
}